

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertexClustering.cpp
# Opt level: O2

void __thiscall VCCluster::VCCluster(VCCluster *this,int id)

{
  _Rb_tree_header *p_Var1;
  
  this->_vptr_VCCluster = (_func_int **)&PTR_addItemAdditionalAct_0019ab60;
  this->id = id;
  (this->items)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->items)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->items)._M_t._M_impl.super__Rb_tree_header;
  (this->items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->items)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->items)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->weightedSum).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
  array[0] = 0.0;
  (this->weightedSum).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
  array[1] = 0.0;
  (this->weightedSum).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
  array[2] = 0.0;
  *(undefined8 *)
   ((long)(this->weightedSum).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
          .m_data.array + 0x11) = 0;
  *(undefined8 *)((long)&this->area + 1) = 0;
  Eigen::DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)&this->E);
  return;
}

Assistant:

VCCluster::VCCluster(int id):id(id), area(0), isNull(false), weightedSum(0,0,0)
{
	E.setZero();
}